

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall
mjs::interpreter::impl::auto_stack_update::auto_stack_update
          (auto_stack_update *this,impl *parent,source_extend *pos)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint32_t uVar2;
  
  this->parent_ = parent;
  (this->old_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (parent->current_extend_).file.
       super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (parent->current_extend_).file.
           super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->old_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  uVar2 = (parent->current_extend_).end;
  (this->old_extend_).start = (parent->current_extend_).start;
  (this->old_extend_).end = uVar2;
  (this->pos_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pos->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (pos->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->pos_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  uVar2 = pos->end;
  (this->pos_).start = pos->start;
  (this->pos_).end = uVar2;
  std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::push_back
            (&this->parent_->stack_trace_,pos);
  return;
}

Assistant:

explicit auto_stack_update(impl& parent, const source_extend& pos)
            : parent_(parent)
            , old_extend_(parent.current_extend_)
#ifndef NDEBUG
            , pos_(pos)
#endif
        {
            parent_.stack_trace_.push_back(pos);
        }